

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arbiter.cpp
# Opt level: O1

unique_ptr<std::vector<char,_std::allocator<char>_>,_std::default_delete<std::vector<char,_std::allocator<char>_>_>_>
 __thiscall arbiter::Arbiter::tryGetBinary(Arbiter *this,string *path)

{
  long *in_RDX;
  _Alloc_hider local_98;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  undefined1 local_78 [16];
  string local_68;
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  local_48[0] = local_38;
  ::std::__cxx11::string::_M_construct<char*>((string *)local_48,*in_RDX,in_RDX[1] + *in_RDX);
  getDriver((Arbiter *)&local_98,path);
  local_88._M_allocated_capacity = (size_type)local_78;
  ::std::__cxx11::string::_M_construct<char*>((string *)&local_88,*in_RDX,in_RDX[1] + *in_RDX);
  stripProtocol(&local_68,(string *)&local_88);
  Driver::tryGetBinary((Driver *)this,(string *)local_98._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  if ((undefined1 *)local_88._M_allocated_capacity != local_78) {
    operator_delete((void *)local_88._M_allocated_capacity);
  }
  if (local_90 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_90);
  }
  if (local_48[0] != local_38) {
    operator_delete(local_48[0]);
  }
  return (__uniq_ptr_data<std::vector<char,_std::allocator<char>_>,_std::default_delete<std::vector<char,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_data<std::vector<char,_std::allocator<char>_>,_std::default_delete<std::vector<char,_std::allocator<char>_>_>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<std::vector<char>> Arbiter::tryGetBinary(std::string path) const
{
    return getDriver(path)->tryGetBinary(stripProtocol(path));
}